

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O3

void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *ctx,int is_enc,void *key,size_t key_size)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  longlong lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (is_enc == 0) {
    __assert_fail("is_enc && \"decryption is not supported (yet)\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/fusion.c"
                  ,0x2af,
                  "void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *, int, const void *, size_t)"
                 );
  }
  if (key_size == 0x10) {
    ctx->rounds = 10;
    alVar1 = *key;
    ctx->keys[0] = alVar1;
    lVar8 = 1;
  }
  else {
    if (key_size != 0x20) {
      __assert_fail("!\"invalid key size; AES128 / AES256 are supported\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/fusion.c"
                    ,699,
                    "void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *, int, const void *, size_t)"
                   );
    }
    ctx->rounds = 0xe;
    lVar3 = *(longlong *)((long)key + 8);
    ctx->keys[0][0] = *key;
    ctx->keys[0][1] = lVar3;
    alVar1 = *(__m128i *)((long)key + 0x10);
    ctx->keys[1] = alVar1;
    lVar8 = 2;
  }
  auVar2 = *(undefined1 (*) [16])((long)ctx + (lVar8 - (key_size >> 4)) * 0x10);
  auVar11 = aeskeygenassist((undefined1  [16])alVar1,1);
  auVar11 = vpshufd_avx(auVar11,0xff);
  auVar12 = vpslldq_avx(auVar2,4);
  auVar2 = auVar2 ^ auVar12;
  auVar12 = vpslldq_avx(auVar2,4);
  auVar2 = auVar2 ^ auVar12;
  auVar12 = vpslldq_avx(auVar2,4);
  auVar11 = auVar11 ^ auVar12 ^ auVar2;
  *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)lVar8 << 4)) = auVar11;
  uVar9 = lVar8 + 1;
  iVar4 = (int)(key_size >> 4);
  if (0x18 < key_size) {
    auVar2 = *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)(((int)uVar9 - iVar4) * 0x10))
    ;
    auVar11 = aeskeygenassist(auVar11,1);
    auVar11 = vpshufd_avx(auVar11,0xaa);
    auVar12 = vpslldq_avx(auVar2,4);
    auVar2 = auVar2 ^ auVar12;
    auVar12 = vpslldq_avx(auVar2,4);
    auVar2 = auVar2 ^ auVar12;
    auVar12 = vpslldq_avx(auVar2,4);
    auVar11 = auVar11 ^ auVar12 ^ auVar2;
    *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar9 << 4)) = auVar11;
    uVar9 = lVar8 + 2;
  }
  uVar5 = (uint)uVar9;
  auVar2 = *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)((uVar5 - iVar4) * 0x10));
  auVar11 = aeskeygenassist(auVar11,2);
  auVar11 = vpshufd_avx(auVar11,0xff);
  auVar12 = vpslldq_avx(auVar2,4);
  auVar2 = auVar2 ^ auVar12;
  auVar12 = vpslldq_avx(auVar2,4);
  auVar2 = auVar2 ^ auVar12;
  auVar12 = vpslldq_avx(auVar2,4);
  auVar11 = auVar11 ^ auVar12 ^ auVar2;
  *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar5 << 4)) = auVar11;
  uVar10 = ctx->rounds;
  if (uVar9 != uVar10) {
    uVar6 = uVar9 + 1;
    if (0x18 < key_size) {
      auVar2 = *(undefined1 (*) [16])
                ((long)ctx->keys[0] + (ulong)(uint)(((int)uVar6 - iVar4) * 0x10));
      auVar11 = aeskeygenassist(auVar11,2);
      auVar11 = vpshufd_avx(auVar11,0xaa);
      auVar12 = vpslldq_avx(auVar2,4);
      auVar2 = auVar2 ^ auVar12;
      auVar12 = vpslldq_avx(auVar2,4);
      auVar2 = auVar2 ^ auVar12;
      auVar12 = vpslldq_avx(auVar2,4);
      auVar11 = auVar11 ^ auVar12 ^ auVar2;
      *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar6 << 4)) = auVar11;
      uVar6 = uVar9 + 2;
    }
    uVar5 = (uint)uVar6;
    auVar2 = *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)((uVar5 - iVar4) * 0x10));
    auVar11 = aeskeygenassist(auVar11,4);
    auVar11 = vpshufd_avx(auVar11,0xff);
    auVar12 = vpslldq_avx(auVar2,4);
    auVar2 = auVar2 ^ auVar12;
    auVar12 = vpslldq_avx(auVar2,4);
    auVar2 = auVar2 ^ auVar12;
    auVar12 = vpslldq_avx(auVar2,4);
    auVar11 = auVar11 ^ auVar12 ^ auVar2;
    *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar5 << 4)) = auVar11;
    uVar10 = ctx->rounds;
    if (uVar6 != uVar10) {
      uVar9 = uVar6 + 1;
      if (0x18 < key_size) {
        auVar2 = *(undefined1 (*) [16])
                  ((long)ctx->keys[0] + (ulong)(uint)(((int)uVar9 - iVar4) * 0x10));
        auVar11 = aeskeygenassist(auVar11,4);
        auVar11 = vpshufd_avx(auVar11,0xaa);
        auVar12 = vpslldq_avx(auVar2,4);
        auVar2 = auVar2 ^ auVar12;
        auVar12 = vpslldq_avx(auVar2,4);
        auVar2 = auVar2 ^ auVar12;
        auVar12 = vpslldq_avx(auVar2,4);
        auVar11 = auVar11 ^ auVar12 ^ auVar2;
        *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar9 << 4)) = auVar11;
        uVar9 = uVar6 + 2;
      }
      uVar5 = (uint)uVar9;
      auVar2 = *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)((uVar5 - iVar4) * 0x10));
      auVar11 = aeskeygenassist(auVar11,8);
      auVar11 = vpshufd_avx(auVar11,0xff);
      auVar12 = vpslldq_avx(auVar2,4);
      auVar2 = auVar2 ^ auVar12;
      auVar12 = vpslldq_avx(auVar2,4);
      auVar2 = auVar2 ^ auVar12;
      auVar12 = vpslldq_avx(auVar2,4);
      auVar11 = auVar11 ^ auVar12 ^ auVar2;
      *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar5 << 4)) = auVar11;
      uVar10 = ctx->rounds;
      if (uVar9 != uVar10) {
        uVar6 = uVar9 + 1;
        if (0x18 < key_size) {
          auVar2 = *(undefined1 (*) [16])
                    ((long)ctx->keys[0] + (ulong)(uint)(((int)uVar6 - iVar4) * 0x10));
          auVar11 = aeskeygenassist(auVar11,8);
          auVar11 = vpshufd_avx(auVar11,0xaa);
          auVar12 = vpslldq_avx(auVar2,4);
          auVar2 = auVar2 ^ auVar12;
          auVar12 = vpslldq_avx(auVar2,4);
          auVar2 = auVar2 ^ auVar12;
          auVar12 = vpslldq_avx(auVar2,4);
          auVar11 = auVar11 ^ auVar12 ^ auVar2;
          *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar6 << 4)) = auVar11;
          uVar6 = uVar9 + 2;
        }
        uVar5 = (uint)uVar6;
        auVar2 = *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)((uVar5 - iVar4) * 0x10));
        auVar11 = aeskeygenassist(auVar11,0x10);
        auVar11 = vpshufd_avx(auVar11,0xff);
        auVar12 = vpslldq_avx(auVar2,4);
        auVar2 = auVar2 ^ auVar12;
        auVar12 = vpslldq_avx(auVar2,4);
        auVar2 = auVar2 ^ auVar12;
        auVar12 = vpslldq_avx(auVar2,4);
        auVar11 = auVar11 ^ auVar12 ^ auVar2;
        *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar5 << 4)) = auVar11;
        uVar10 = ctx->rounds;
        if (uVar6 != uVar10) {
          uVar9 = uVar6 + 1;
          if (0x18 < key_size) {
            auVar2 = *(undefined1 (*) [16])
                      ((long)ctx->keys[0] + (ulong)(uint)(((int)uVar9 - iVar4) * 0x10));
            auVar11 = aeskeygenassist(auVar11,0x10);
            auVar11 = vpshufd_avx(auVar11,0xaa);
            auVar12 = vpslldq_avx(auVar2,4);
            auVar2 = auVar2 ^ auVar12;
            auVar12 = vpslldq_avx(auVar2,4);
            auVar2 = auVar2 ^ auVar12;
            auVar12 = vpslldq_avx(auVar2,4);
            auVar11 = auVar11 ^ auVar12 ^ auVar2;
            *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar9 << 4)) = auVar11;
            uVar9 = uVar6 + 2;
          }
          uVar5 = (uint)uVar9;
          auVar2 = *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)((uVar5 - iVar4) * 0x10));
          auVar11 = aeskeygenassist(auVar11,0x20);
          auVar11 = vpshufd_avx(auVar11,0xff);
          auVar12 = vpslldq_avx(auVar2,4);
          auVar2 = auVar2 ^ auVar12;
          auVar12 = vpslldq_avx(auVar2,4);
          auVar2 = auVar2 ^ auVar12;
          auVar12 = vpslldq_avx(auVar2,4);
          auVar11 = auVar11 ^ auVar12 ^ auVar2;
          *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar5 << 4)) = auVar11;
          uVar10 = ctx->rounds;
          if (uVar9 != uVar10) {
            uVar6 = uVar9 + 1;
            if (0x18 < key_size) {
              auVar2 = *(undefined1 (*) [16])
                        ((long)ctx->keys[0] + (ulong)(uint)(((int)uVar6 - iVar4) * 0x10));
              auVar11 = aeskeygenassist(auVar11,0x20);
              auVar11 = vpshufd_avx(auVar11,0xaa);
              auVar12 = vpslldq_avx(auVar2,4);
              auVar2 = auVar2 ^ auVar12;
              auVar12 = vpslldq_avx(auVar2,4);
              auVar2 = auVar2 ^ auVar12;
              auVar12 = vpslldq_avx(auVar2,4);
              auVar11 = auVar11 ^ auVar12 ^ auVar2;
              *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar6 << 4)) = auVar11;
              uVar6 = uVar9 + 2;
            }
            uVar5 = (uint)uVar6;
            auVar2 = *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)((uVar5 - iVar4) * 0x10));
            auVar11 = aeskeygenassist(auVar11,0x40);
            auVar11 = vpshufd_avx(auVar11,0xff);
            auVar12 = vpslldq_avx(auVar2,4);
            auVar2 = auVar2 ^ auVar12;
            auVar12 = vpslldq_avx(auVar2,4);
            auVar2 = auVar2 ^ auVar12;
            auVar12 = vpslldq_avx(auVar2,4);
            auVar11 = auVar11 ^ auVar12 ^ auVar2;
            *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar5 << 4)) = auVar11;
            uVar10 = ctx->rounds;
            if (uVar6 != uVar10) {
              uVar9 = uVar6 + 1;
              if (0x18 < key_size) {
                auVar2 = *(undefined1 (*) [16])
                          ((long)ctx->keys[0] + (ulong)(uint)(((int)uVar9 - iVar4) * 0x10));
                auVar11 = aeskeygenassist(auVar11,0x40);
                auVar11 = vpshufd_avx(auVar11,0xaa);
                auVar12 = vpslldq_avx(auVar2,4);
                auVar2 = auVar2 ^ auVar12;
                auVar12 = vpslldq_avx(auVar2,4);
                auVar2 = auVar2 ^ auVar12;
                auVar12 = vpslldq_avx(auVar2,4);
                auVar11 = auVar11 ^ auVar12 ^ auVar2;
                *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar9 << 4)) =
                     auVar11;
                uVar9 = uVar6 + 2;
              }
              uVar5 = (uint)uVar9;
              auVar2 = *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)((uVar5 - iVar4) * 0x10));
              auVar11 = aeskeygenassist(auVar11,0x80);
              auVar11 = vpshufd_avx(auVar11,0xff);
              auVar12 = vpslldq_avx(auVar2,4);
              auVar2 = auVar2 ^ auVar12;
              auVar12 = vpslldq_avx(auVar2,4);
              auVar2 = auVar2 ^ auVar12;
              auVar12 = vpslldq_avx(auVar2,4);
              auVar11 = auVar11 ^ auVar12 ^ auVar2;
              *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar5 << 4)) = auVar11;
              uVar10 = ctx->rounds;
              if (uVar9 != uVar10) {
                uVar6 = uVar9 + 1;
                if (0x18 < key_size) {
                  auVar2 = *(undefined1 (*) [16])
                            ((long)ctx->keys[0] + (ulong)(uint)(((int)uVar6 - iVar4) * 0x10));
                  auVar11 = aeskeygenassist(auVar11,0x80);
                  auVar11 = vpshufd_avx(auVar11,0xaa);
                  auVar12 = vpslldq_avx(auVar2,4);
                  auVar2 = auVar2 ^ auVar12;
                  auVar12 = vpslldq_avx(auVar2,4);
                  auVar2 = auVar2 ^ auVar12;
                  auVar12 = vpslldq_avx(auVar2,4);
                  auVar11 = auVar11 ^ auVar12 ^ auVar2;
                  *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar6 << 4)) =
                       auVar11;
                  uVar6 = uVar9 + 2;
                }
                uVar5 = (uint)uVar6;
                auVar2 = *(undefined1 (*) [16])
                          ((long)ctx->keys[0] + (ulong)((uVar5 - iVar4) * 0x10));
                auVar11 = aeskeygenassist(auVar11,0x1b);
                auVar11 = vpshufd_avx(auVar11,0xff);
                auVar12 = vpslldq_avx(auVar2,4);
                auVar2 = auVar2 ^ auVar12;
                auVar12 = vpslldq_avx(auVar2,4);
                auVar2 = auVar2 ^ auVar12;
                auVar12 = vpslldq_avx(auVar2,4);
                auVar11 = auVar11 ^ auVar12 ^ auVar2;
                *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar5 << 4)) = auVar11;
                uVar10 = ctx->rounds;
                if (uVar6 != uVar10) {
                  uVar9 = uVar6 + 1;
                  if (0x18 < key_size) {
                    auVar2 = *(undefined1 (*) [16])
                              ((long)ctx->keys[0] + (ulong)(uint)(((int)uVar9 - iVar4) * 0x10));
                    auVar11 = aeskeygenassist(auVar11,0x1b);
                    auVar11 = vpshufd_avx(auVar11,0xaa);
                    auVar12 = vpslldq_avx(auVar2,4);
                    auVar2 = auVar2 ^ auVar12;
                    auVar12 = vpslldq_avx(auVar2,4);
                    auVar2 = auVar2 ^ auVar12;
                    auVar12 = vpslldq_avx(auVar2,4);
                    auVar11 = auVar11 ^ auVar12 ^ auVar2;
                    *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar9 << 4)) =
                         auVar11;
                    uVar9 = uVar6 + 2;
                  }
                  uVar7 = (uint)uVar9;
                  auVar2 = *(undefined1 (*) [16])
                            ((long)ctx->keys[0] + (ulong)((uVar7 - iVar4) * 0x10));
                  auVar11 = aeskeygenassist(auVar11,0x36);
                  auVar11 = vpshufd_avx(auVar11,0xff);
                  auVar12 = vpslldq_avx(auVar2,4);
                  auVar2 = auVar2 ^ auVar12;
                  auVar12 = vpslldq_avx(auVar2,4);
                  auVar2 = auVar2 ^ auVar12;
                  auVar12 = vpslldq_avx(auVar2,4);
                  auVar11 = auVar11 ^ auVar12 ^ auVar2;
                  *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar7 << 4)) = auVar11;
                  uVar10 = ctx->rounds;
                  uVar5 = uVar7;
                  if ((uVar9 != uVar10) && (uVar5 = uVar7 + 1, 0x18 < key_size)) {
                    auVar2 = *(undefined1 (*) [16])
                              ((long)ctx->keys[0] + (ulong)((uVar5 - iVar4) * 0x10));
                    auVar11 = aeskeygenassist(auVar11,0x36);
                    auVar11 = vpshufd_avx(auVar11,0xaa);
                    auVar12 = vpslldq_avx(auVar2,4);
                    auVar2 = auVar2 ^ auVar12;
                    auVar12 = vpslldq_avx(auVar2,4);
                    auVar2 = auVar2 ^ auVar12;
                    auVar12 = vpslldq_avx(auVar2,4);
                    *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uVar5 * 0x10)) =
                         auVar11 ^ auVar12 ^ auVar2;
                    uVar5 = uVar7 + 2;
                    uVar10 = ctx->rounds;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (uVar5 != uVar10) {
    __assert_fail("i == ctx->rounds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/fusion.c"
                  ,0x2dc,
                  "void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *, int, const void *, size_t)"
                 );
  }
  return;
}

Assistant:

void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *ctx, int is_enc, const void *key, size_t key_size)
{
    assert(is_enc && "decryption is not supported (yet)");

    size_t i = 0;

    switch (key_size) {
    case 16: /* AES128 */
        ctx->rounds = 10;
        break;
    case 32: /* AES256 */
        ctx->rounds = 14;
        break;
    default:
        assert(!"invalid key size; AES128 / AES256 are supported");
        break;
    }

    ctx->keys[i++] = _mm_loadu_si128((__m128i *)key);
    if (key_size == 32)
        ctx->keys[i++] = _mm_loadu_si128((__m128i *)key + 1);

#define EXPAND(R)                                                                                                                  \
    do {                                                                                                                           \
        ctx->keys[i] = expand_key(ctx->keys[i - key_size / 16],                                                                    \
                                  _mm_shuffle_epi32(_mm_aeskeygenassist_si128(ctx->keys[i - 1], R), _MM_SHUFFLE(3, 3, 3, 3)));     \
        if (i == ctx->rounds)                                                                                                      \
            goto Done;                                                                                                             \
        ++i;                                                                                                                       \
        if (key_size > 24) {                                                                                                       \
            ctx->keys[i] = expand_key(ctx->keys[i - key_size / 16],                                                                \
                                      _mm_shuffle_epi32(_mm_aeskeygenassist_si128(ctx->keys[i - 1], R), _MM_SHUFFLE(2, 2, 2, 2))); \
            ++i;                                                                                                                   \
        }                                                                                                                          \
    } while (0)
    EXPAND(0x1);
    EXPAND(0x2);
    EXPAND(0x4);
    EXPAND(0x8);
    EXPAND(0x10);
    EXPAND(0x20);
    EXPAND(0x40);
    EXPAND(0x80);
    EXPAND(0x1b);
    EXPAND(0x36);
#undef EXPAND
Done:
    assert(i == ctx->rounds);
}